

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

void dec_get_tb_width_height(int w,int h,com_part_size_t part,int *tb_w,int *tb_h)

{
  int *tb_h_local;
  int *tb_w_local;
  int local_10;
  com_part_size_t part_local;
  int h_local;
  int w_local;
  
  local_10 = h;
  part_local = w;
  switch(part) {
  case SIZE_2Nx2N:
    break;
  default:
    break;
  case SIZE_NxN:
    part_local = w >> 1;
    local_10 = h >> 1;
    break;
  case SIZE_2NxhN:
    local_10 = h >> 2;
    break;
  case SIZE_hNx2N:
    part_local = w >> 2;
  }
  *tb_w = part_local;
  *tb_h = local_10;
  return;
}

Assistant:

void dec_get_tb_width_height(int w, int h, com_part_size_t part, int *tb_w, int *tb_h)
{
    switch (part) {
    case SIZE_2Nx2N:
        break;
    case SIZE_NxN:
        w >>= 1;
        h >>= 1;
        break;
    case SIZE_2NxhN:
        h >>= 2;
        break;
    case SIZE_hNx2N:
        w >>= 2;
        break;
    default:
        uavs3d_assert(0);
        break;
    }

    *tb_w = w;
    *tb_h = h;
}